

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

bool testing::internal::TuplePrefix<5ul>::
     Matches<std::tuple<testing::Matcher<int_const*>,testing::Matcher<unsigned_int>,testing::Matcher<void*>,testing::Matcher<unsigned_long*>,testing::Matcher<void_const*>,testing::Matcher<unsigned_long>>,std::tuple<int_const*,unsigned_int,void*,unsigned_long*,void_const*,unsigned_long>>
               (tuple<testing::Matcher<const_int_*>,_testing::Matcher<unsigned_int>,_testing::Matcher<void_*>,_testing::Matcher<unsigned_long_*>,_testing::Matcher<const_void_*>,_testing::Matcher<unsigned_long>_>
                *matcher_tuple,
               tuple<const_int_*,_unsigned_int,_void_*,_unsigned_long_*,_const_void_*,_unsigned_long>
               *value_tuple)

{
  bool bVar1;
  MatcherBase<const_void_*> *this;
  __tuple_element_t<4UL,_tuple<const_int_*,_unsigned_int,_void_*,_unsigned_long_*,_const_void_*,_unsigned_long>_>
  *x;
  undefined1 local_19;
  tuple<const_int_*,_unsigned_int,_void_*,_unsigned_long_*,_const_void_*,_unsigned_long>
  *value_tuple_local;
  tuple<testing::Matcher<const_int_*>,_testing::Matcher<unsigned_int>,_testing::Matcher<void_*>,_testing::Matcher<unsigned_long_*>,_testing::Matcher<const_void_*>,_testing::Matcher<unsigned_long>_>
  *matcher_tuple_local;
  
  bVar1 = TuplePrefix<4ul>::
          Matches<std::tuple<testing::Matcher<int_const*>,testing::Matcher<unsigned_int>,testing::Matcher<void*>,testing::Matcher<unsigned_long*>,testing::Matcher<void_const*>,testing::Matcher<unsigned_long>>,std::tuple<int_const*,unsigned_int,void*,unsigned_long*,void_const*,unsigned_long>>
                    (matcher_tuple,value_tuple);
  local_19 = false;
  if (bVar1) {
    this = &std::
            get<4ul,testing::Matcher<int_const*>,testing::Matcher<unsigned_int>,testing::Matcher<void*>,testing::Matcher<unsigned_long*>,testing::Matcher<void_const*>,testing::Matcher<unsigned_long>>
                      (matcher_tuple)->super_MatcherBase<const_void_*>;
    x = std::get<4ul,int_const*,unsigned_int,void*,unsigned_long*,void_const*,unsigned_long>
                  (value_tuple);
    local_19 = MatcherBase<const_void_*>::Matches(this,x);
  }
  return local_19;
}

Assistant:

static bool Matches(const MatcherTuple& matcher_tuple,
                      const ValueTuple& value_tuple) {
    return TuplePrefix<N - 1>::Matches(matcher_tuple, value_tuple) &&
           std::get<N - 1>(matcher_tuple).Matches(std::get<N - 1>(value_tuple));
  }